

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_packed_varyings.cpp
# Opt level: O2

uint __thiscall
anon_unknown.dwarf_16cebd::lower_packed_varyings_visitor::lower_rvalue
          (lower_packed_varyings_visitor *this,ir_rvalue *rvalue,uint fine_location,
          ir_variable *unpacked_var,char *name,bool gs_input_toplevel,uint vertex_index)

{
  uint *puVar1;
  byte bVar2;
  char cVar3;
  exec_node *peVar4;
  deref lhs;
  deref lhs_00;
  deref lhs_01;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  undefined4 extraout_var;
  ir_dereference_record *this_00;
  char *pcVar12;
  ir_swizzle *this_01;
  ir_swizzle *this_02;
  undefined4 extraout_var_00;
  char *name_00;
  glsl_type *pgVar13;
  ir_variable *piVar14;
  ir_dereference_array *this_03;
  ir_constant *this_04;
  ir_dereference_array *this_05;
  undefined4 extraout_var_01;
  operand oVar15;
  operand a;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  operand a_00;
  operand a_01;
  operand a_02;
  operand a_03;
  operand a_04;
  operand a_05;
  operand oVar16;
  ir_assignment *piVar17;
  byte bVar18;
  ulong uVar19;
  exec_node *peVar20;
  uint uVar21;
  int iVar22;
  exec_list *peVar23;
  uint uVar24;
  ir_expression_operation iVar25;
  long lVar26;
  uint i;
  ulong uVar27;
  char right_swizzle_name [4];
  undefined4 uStack_74;
  char left_swizzle_name [4];
  undefined4 uStack_6c;
  uint right_swizzle_values [4];
  uint swizzle_values [4];
  undefined4 extraout_var_02;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  
  pgVar13 = rvalue->type;
  uVar7 = *(uint *)&pgVar13->field_0x4;
  uVar24 = uVar7 & 0xff;
  bVar18 = 0;
  if ((byte)(uVar24 - 4) < 10) {
    bVar18 = (byte)*(undefined4 *)(&DAT_0021dc70 + (ulong)(uVar24 - 4 & 0xff) * 4);
  }
  if (gs_input_toplevel && uVar24 != 0x11) {
    __assert_fail("!gs_input_toplevel || rvalue->type->is_array()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                  ,0x20d,
                  "unsigned int (anonymous namespace)::lower_packed_varyings_visitor::lower_rvalue(ir_rvalue *, unsigned int, ir_variable *, const char *, bool, unsigned int)"
                 );
  }
  if ((byte)uVar7 == 0x11) {
    uVar21 = pgVar13->length;
LAB_001e1e98:
    uVar7 = lower_arraylike(this,rvalue,uVar21,fine_location,unpacked_var,name,gs_input_toplevel,
                            vertex_index);
    return uVar7;
  }
  if (uVar24 == 0xf) {
    lVar26 = 0;
    for (uVar27 = 0; uVar27 < pgVar13->length; uVar27 = uVar27 + 1) {
      if (lVar26 != 0) {
        iVar6 = (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])(rvalue,this->mem_ctx,0);
        rvalue = (ir_rvalue *)CONCAT44(extraout_var,iVar6);
        pgVar13 = rvalue->type;
      }
      pcVar12 = *(char **)(&((pgVar13->fields).array)->vector_elements + lVar26);
      this_00 = (ir_dereference_record *)exec_node::operator_new(0x38,this->mem_ctx);
      ir_dereference_record::ir_dereference_record(this_00,rvalue,pcVar12);
      pcVar12 = ralloc_asprintf(this->mem_ctx,"%s.%s",name,pcVar12);
      fine_location =
           lower_rvalue(this,(ir_rvalue *)this_00,fine_location,unpacked_var,pcVar12,false,
                        vertex_index);
      pgVar13 = rvalue->type;
      lVar26 = lVar26 + 0x30;
    }
    return fine_location;
  }
  uVar21 = (uint)pgVar13->matrix_columns;
  if (uVar24 - 2 < 3 && 1 < uVar21) {
    gs_input_toplevel = false;
    goto LAB_001e1e98;
  }
  bVar2 = pgVar13->vector_elements;
  uVar21 = (uint)bVar2 << (bVar18 & 0x1f);
  uVar27 = (ulong)uVar21;
  uVar24 = fine_location & 3;
  if (4 < uVar21 + uVar24) {
    left_swizzle_name[0] = '\0';
    left_swizzle_name[1] = '\0';
    left_swizzle_name[2] = '\0';
    left_swizzle_name[3] = '\0';
    swizzle_values[0] = 0;
    swizzle_values[1] = 0;
    swizzle_values[2] = 0;
    swizzle_values[3] = 0;
    right_swizzle_name[0] = '\0';
    right_swizzle_name[1] = '\0';
    right_swizzle_name[2] = '\0';
    right_swizzle_name[3] = '\0';
    right_swizzle_values[0] = 0;
    right_swizzle_values[1] = 0;
    right_swizzle_values[2] = 0;
    right_swizzle_values[3] = 0;
    uVar24 = 4 - uVar24;
    if (((byte)uVar7 < 0xe) && ((0x3610U >> (uVar7 & 0x1f) & 1) != 0)) {
      uVar24 = uVar24 >> 1;
    }
    for (uVar27 = 0; uVar24 != uVar27; uVar27 = uVar27 + 1) {
      swizzle_values[uVar27] = (uint)uVar27;
      left_swizzle_name[uVar27] = "xyzw"[uVar27];
    }
    uVar7 = bVar2 - uVar24;
    for (uVar27 = 0; uVar7 != uVar27; uVar27 = uVar27 + 1) {
      uVar21 = (int)uVar27 + uVar24;
      right_swizzle_values[uVar27] = uVar21;
      right_swizzle_name[uVar27] = "xyzw"[uVar21];
    }
    this_01 = (ir_swizzle *)exec_node::operator_new(0x38,this->mem_ctx);
    ir_swizzle::ir_swizzle(this_01,rvalue,swizzle_values,uVar24);
    this_02 = (ir_swizzle *)exec_node::operator_new(0x38,this->mem_ctx);
    iVar6 = (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])(rvalue,this->mem_ctx,0);
    ir_swizzle::ir_swizzle
              (this_02,(ir_rvalue *)CONCAT44(extraout_var_00,iVar6),right_swizzle_values,uVar7);
    pcVar12 = ralloc_asprintf(this->mem_ctx,"%s.%s",name,left_swizzle_name);
    name_00 = ralloc_asprintf(this->mem_ctx,"%s.%s",name,right_swizzle_name);
    if ((ulong)uVar24 == 0) {
      uVar7 = fine_location + 1;
    }
    else {
      uVar7 = lower_rvalue(this,(ir_rvalue *)this_01,fine_location,unpacked_var,pcVar12,false,
                           vertex_index);
    }
    uVar7 = lower_rvalue(this,(ir_rvalue *)this_02,uVar7,unpacked_var,name_00,false,vertex_index);
    return uVar7;
  }
  swizzle_values[0] = 0;
  swizzle_values[1] = 0;
  swizzle_values[2] = 0;
  swizzle_values[3] = 0;
  for (uVar19 = 0; uVar27 != uVar19; uVar19 = uVar19 + 1) {
    swizzle_values[uVar19] = (int)uVar19 + uVar24;
  }
  uVar7 = (fine_location >> 2) - 0x20;
  if (this->locations_used <= uVar7) {
    __assert_fail("slot < locations_used",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                  ,700,
                  "ir_dereference *(anonymous namespace)::lower_packed_varyings_visitor::get_packed_varying_deref(unsigned int, ir_variable *, const char *, unsigned int)"
                 );
  }
  piVar14 = this->packed_varyings[uVar7];
  if (piVar14 == (ir_variable *)0x0) {
    pcVar12 = ralloc_asprintf(this->mem_ctx,"packed:%s",name);
    if (this->components[uVar7] == '\0') {
      __assert_fail("components[slot] != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x2c0,
                    "ir_dereference *(anonymous namespace)::lower_packed_varyings_visitor::get_packed_varying_deref(unsigned int, ir_variable *, const char *, unsigned int)"
                   );
    }
    bVar5 = ir_variable::is_interpolation_flat(unpacked_var);
    pgVar13 = glsl_type::get_instance(2 - bVar5,(uint)this->components[uVar7],1,0,false);
    if (this->gs_input_vertices != 0) {
      pgVar13 = glsl_type::get_array_instance(pgVar13,this->gs_input_vertices,0);
    }
    piVar14 = (ir_variable *)exec_node::operator_new(0x90,this->mem_ctx);
    ir_variable::ir_variable(piVar14,pgVar13,pcVar12,this->mode);
    if (this->gs_input_vertices != 0) {
      (piVar14->data).max_array_access = this->gs_input_vertices - 1;
    }
    uVar8 = *(uint *)&unpacked_var->data & 2;
    uVar10 = *(uint *)&piVar14->data;
    *(uint *)&piVar14->data = uVar10 & 0xfffffffd | uVar8;
    uVar9 = *(uint *)&unpacked_var->data & 4;
    *(uint *)&piVar14->data = uVar10 & 0xfffffff9 | uVar8 | uVar9;
    *(uint *)&piVar14->data = uVar10 & 0xfffffff1 | uVar8 | uVar9 | *(uint *)&unpacked_var->data & 8
    ;
    pgVar13 = glsl_type::without_array(pgVar13);
    if (pgVar13 == &glsl_type::_ivec4_type) {
      uVar10 = 0x20000;
    }
    else {
      uVar10 = *(uint *)&unpacked_var->data & 0x30000;
    }
    uVar8 = *(uint *)&piVar14->data;
    *(uint *)&piVar14->data = uVar8 & 0xfffcffff | uVar10;
    (piVar14->data).location = fine_location >> 2;
    *(ushort *)&(piVar14->data).field_0x4 =
         (ushort)*(undefined4 *)&(piVar14->data).field_0x4 & 0xff9f |
         *(ushort *)&(unpacked_var->data).field_0x4 & 0x60;
    *(uint *)&piVar14->data = uVar8 & 0xfffcfdff | uVar10 | *(uint *)&unpacked_var->data & 0x200;
    (piVar14->data).stream = 0x80000000;
    peVar20 = &(piVar14->super_ir_instruction).super_exec_node;
    (piVar14->super_ir_instruction).super_exec_node.next =
         &(unpacked_var->super_ir_instruction).super_exec_node;
    peVar4 = (unpacked_var->super_ir_instruction).super_exec_node.prev;
    (piVar14->super_ir_instruction).super_exec_node.prev = peVar4;
    peVar4->next = peVar20;
    (unpacked_var->super_ir_instruction).super_exec_node.prev = peVar20;
    this->packed_varyings[uVar7] = piVar14;
  }
  else {
    *(uint *)&piVar14->data = *(uint *)&piVar14->data | *(uint *)&unpacked_var->data & 0x200;
    if ((vertex_index == 0) || (this->gs_input_vertices == 0)) {
      pcVar12 = piVar14->name;
      if (pcVar12 == piVar14->name_storage || pcVar12 == "compiler_temp") {
        pcVar12 = ralloc_asprintf(piVar14,"%s,%s",pcVar12,name);
        piVar14->name = pcVar12;
      }
      else {
        ralloc_asprintf_append(&piVar14->name,",%s",name);
      }
    }
  }
  this_03 = (ir_dereference_array *)exec_node::operator_new(0x30,this->mem_ctx);
  ir_dereference_variable::ir_dereference_variable
            ((ir_dereference_variable *)this_03,this->packed_varyings[uVar7]);
  this_05 = this_03;
  if (this->gs_input_vertices != 0) {
    this_04 = (ir_constant *)exec_node::operator_new(0xb0,this->mem_ctx);
    ir_constant::ir_constant(this_04,vertex_index,1);
    this_05 = (ir_dereference_array *)exec_node::operator_new(0x38,this->mem_ctx);
    ir_dereference_array::ir_dereference_array(this_05,(ir_rvalue *)this_03,(ir_rvalue *)this_04);
  }
  uVar7 = (unpacked_var->data).stream;
  if (uVar7 != 0) {
    if (3 < uVar7) {
      __assert_fail("unpacked_var->data.stream < 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x267,
                    "unsigned int (anonymous namespace)::lower_packed_varyings_visitor::lower_rvalue(ir_rvalue *, unsigned int, ir_variable *, const char *, bool, unsigned int)"
                   );
    }
    iVar11 = (*(this_05->super_ir_dereference).super_ir_rvalue.super_ir_instruction.
               _vptr_ir_instruction[8])(this_05);
    iVar6 = uVar24 * 2;
    while (iVar22 = (int)uVar27, uVar27 = (ulong)(iVar22 - 1), iVar22 != 0) {
      puVar1 = (uint *)(CONCAT44(extraout_var_01,iVar11) + 0x58);
      *puVar1 = *puVar1 | (unpacked_var->data).stream << ((byte)iVar6 & 0x1f);
      iVar6 = iVar6 + 2;
    }
  }
  oVar15.val = (ir_rvalue *)exec_node::operator_new(0x38,this->mem_ctx);
  ir_swizzle::ir_swizzle((ir_swizzle *)oVar15.val,(ir_rvalue *)this_05,swizzle_values,uVar21);
  if (this->mode != ir_var_shader_out) {
    pgVar13 = rvalue->type;
    cVar3 = (oVar15.val)->type->field_0x4;
    oVar16.val = oVar15.val;
    if (pgVar13->field_0x4 == cVar3) goto LAB_001e2ceb;
    if (cVar3 != '\x01') {
      __assert_fail("rhs->type->base_type == GLSL_TYPE_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x1a4,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                   );
    }
    switch(pgVar13->field_0x4) {
    case 0:
      oVar16.val = (ir_rvalue *)exec_node::operator_new(0x58,this->mem_ctx);
      pgVar13 = rvalue->type;
      iVar6 = 0x15;
      break;
    default:
      __assert_fail("!\"Unexpected type conversion while lowering varyings\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x1e4,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                   );
    case 2:
      oVar16.val = (ir_rvalue *)exec_node::operator_new(0x58,this->mem_ctx);
      pgVar13 = rvalue->type;
      iVar6 = 0x22;
      break;
    case 4:
      if (2 < pgVar13->vector_elements) {
        __assert_fail("lhs->type->vector_elements <= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x1af,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      if (pgVar13->vector_elements != 2) {
        oVar15.val = &ir_builder::i2u(oVar15)->super_ir_rvalue;
        iVar25 = ir_unop_pack_double_2x32;
LAB_001e2ce3:
        oVar16.val = &ir_builder::expr(iVar25,oVar15)->super_ir_rvalue;
        goto LAB_001e2ceb;
      }
      piVar14 = (ir_variable *)exec_node::operator_new(0x90,this->mem_ctx);
      ir_variable::ir_variable(piVar14,rvalue->type,"unpack",ir_var_temporary);
      if ((oVar15.val)->type->vector_elements != '\x04') {
        __assert_fail("rhs->type->vector_elements == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x1b2,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      peVar23 = this->out_variables;
      peVar20 = &(piVar14->super_ir_instruction).super_exec_node;
      (piVar14->super_ir_instruction).super_exec_node.next = &peVar23->tail_sentinel;
      peVar4 = (peVar23->tail_sentinel).prev;
      (piVar14->super_ir_instruction).super_exec_node.prev = peVar4;
      peVar4->next = peVar20;
      (peVar23->tail_sentinel).prev = peVar20;
      peVar23 = this->out_instructions;
      ir_builder::deref::deref((deref *)right_swizzle_values,piVar14);
      a_01.val._0_4_ =
           (*((oVar15.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar15.val,this->mem_ctx,0);
      a_01.val._4_4_ = extraout_var_06;
      oVar16.val = &ir_builder::swizzle_xy(a_01)->super_ir_rvalue;
      oVar16.val = &ir_builder::i2u(oVar16)->super_ir_rvalue;
      oVar16.val = &ir_builder::expr(ir_unop_pack_double_2x32,oVar16)->super_ir_rvalue;
      piVar17 = ir_builder::assign((deref)right_swizzle_values._0_8_,oVar16,1);
      if (piVar17 != (ir_assignment *)0x0) {
        piVar17 = (ir_assignment *)&(piVar17->super_ir_instruction).super_exec_node;
      }
      (piVar17->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
      peVar4 = (peVar23->tail_sentinel).prev;
      (piVar17->super_ir_instruction).super_exec_node.next = peVar4;
      peVar4->next = (exec_node *)piVar17;
      (peVar23->tail_sentinel).prev = (exec_node *)piVar17;
      peVar23 = this->out_instructions;
      ir_builder::deref::deref((deref *)left_swizzle_name,piVar14);
      a_02.val._0_4_ =
           (*((oVar15.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar15.val,this->mem_ctx,0);
      a_02.val._4_4_ = extraout_var_07;
      oVar15.val = &ir_builder::swizzle(a_02,0x69a,2)->super_ir_rvalue;
      oVar15.val = &ir_builder::i2u(oVar15)->super_ir_rvalue;
      iVar25 = ir_unop_pack_double_2x32;
      goto LAB_001e2bd6;
    case 9:
      if (2 < pgVar13->vector_elements) {
        __assert_fail("lhs->type->vector_elements <= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x1cd,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      if (pgVar13->vector_elements != 2) {
        oVar15.val = &ir_builder::i2u(oVar15)->super_ir_rvalue;
        iVar25 = ir_unop_pack_uint_2x32;
        goto LAB_001e2ce3;
      }
      piVar14 = (ir_variable *)exec_node::operator_new(0x90,this->mem_ctx);
      ir_variable::ir_variable(piVar14,rvalue->type,"unpack",ir_var_temporary);
      if ((oVar15.val)->type->vector_elements != '\x04') {
        __assert_fail("rhs->type->vector_elements == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x1d0,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      peVar23 = this->out_variables;
      peVar20 = &(piVar14->super_ir_instruction).super_exec_node;
      (piVar14->super_ir_instruction).super_exec_node.next = &peVar23->tail_sentinel;
      peVar4 = (peVar23->tail_sentinel).prev;
      (piVar14->super_ir_instruction).super_exec_node.prev = peVar4;
      peVar4->next = peVar20;
      (peVar23->tail_sentinel).prev = peVar20;
      peVar23 = this->out_instructions;
      ir_builder::deref::deref((deref *)right_swizzle_values,piVar14);
      a_04.val._0_4_ =
           (*((oVar15.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar15.val,this->mem_ctx,0);
      a_04.val._4_4_ = extraout_var_09;
      oVar16.val = &ir_builder::swizzle_xy(a_04)->super_ir_rvalue;
      oVar16.val = &ir_builder::i2u(oVar16)->super_ir_rvalue;
      oVar16.val = &ir_builder::expr(ir_unop_pack_uint_2x32,oVar16)->super_ir_rvalue;
      piVar17 = ir_builder::assign((deref)right_swizzle_values._0_8_,oVar16,1);
      if (piVar17 != (ir_assignment *)0x0) {
        piVar17 = (ir_assignment *)&(piVar17->super_ir_instruction).super_exec_node;
      }
      (piVar17->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
      peVar4 = (peVar23->tail_sentinel).prev;
      (piVar17->super_ir_instruction).super_exec_node.next = peVar4;
      peVar4->next = (exec_node *)piVar17;
      (peVar23->tail_sentinel).prev = (exec_node *)piVar17;
      peVar23 = this->out_instructions;
      ir_builder::deref::deref((deref *)left_swizzle_name,piVar14);
      a_05.val._0_4_ =
           (*((oVar15.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar15.val,this->mem_ctx,0);
      a_05.val._4_4_ = extraout_var_10;
      oVar15.val = &ir_builder::swizzle(a_05,0x69a,2)->super_ir_rvalue;
      oVar15.val = &ir_builder::i2u(oVar15)->super_ir_rvalue;
      iVar25 = ir_unop_pack_uint_2x32;
LAB_001e2bd6:
      oVar15.val = &ir_builder::expr(iVar25,oVar15)->super_ir_rvalue;
      lhs_01.val._4_4_ = uStack_6c;
      lhs_01.val._0_1_ = left_swizzle_name[0];
      lhs_01.val._1_1_ = left_swizzle_name[1];
      lhs_01.val._2_1_ = left_swizzle_name[2];
      lhs_01.val._3_1_ = left_swizzle_name[3];
      piVar17 = ir_builder::assign(lhs_01,oVar15,2);
      if (piVar17 != (ir_assignment *)0x0) {
        piVar17 = (ir_assignment *)&(piVar17->super_ir_instruction).super_exec_node;
      }
      (piVar17->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
      peVar4 = (peVar23->tail_sentinel).prev;
      (piVar17->super_ir_instruction).super_exec_node.next = peVar4;
      peVar4->next = (exec_node *)piVar17;
      (peVar23->tail_sentinel).prev = (exec_node *)piVar17;
      ir_builder::deref::deref((deref *)right_swizzle_name,piVar14);
LAB_001e2c25:
      oVar16.val = (ir_rvalue *)CONCAT44(uStack_74,right_swizzle_name);
      goto LAB_001e2ceb;
    case 10:
      if (2 < pgVar13->vector_elements) {
        __assert_fail("lhs->type->vector_elements <= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x1be,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      if (pgVar13->vector_elements != 2) {
        iVar25 = ir_unop_pack_int_2x32;
        goto LAB_001e2ce3;
      }
      piVar14 = (ir_variable *)exec_node::operator_new(0x90,this->mem_ctx);
      ir_variable::ir_variable(piVar14,rvalue->type,"unpack",ir_var_temporary);
      if ((oVar15.val)->type->vector_elements != '\x04') {
        __assert_fail("rhs->type->vector_elements == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x1c1,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_unpack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      peVar23 = this->out_variables;
      peVar20 = &(piVar14->super_ir_instruction).super_exec_node;
      (piVar14->super_ir_instruction).super_exec_node.next = &peVar23->tail_sentinel;
      peVar4 = (peVar23->tail_sentinel).prev;
      (piVar14->super_ir_instruction).super_exec_node.prev = peVar4;
      peVar4->next = peVar20;
      (peVar23->tail_sentinel).prev = peVar20;
      peVar23 = this->out_instructions;
      ir_builder::deref::deref((deref *)right_swizzle_values,piVar14);
      oVar16.val._0_4_ =
           (*((oVar15.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar15.val,this->mem_ctx,0);
      oVar16.val._4_4_ = extraout_var_03;
      oVar16.val = &ir_builder::swizzle_xy(oVar16)->super_ir_rvalue;
      oVar16.val = &ir_builder::expr(ir_unop_pack_int_2x32,oVar16)->super_ir_rvalue;
      piVar17 = ir_builder::assign((deref)right_swizzle_values._0_8_,oVar16,1);
      if (piVar17 != (ir_assignment *)0x0) {
        piVar17 = (ir_assignment *)&(piVar17->super_ir_instruction).super_exec_node;
      }
      (piVar17->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
      peVar4 = (peVar23->tail_sentinel).prev;
      (piVar17->super_ir_instruction).super_exec_node.next = peVar4;
      peVar4->next = (exec_node *)piVar17;
      (peVar23->tail_sentinel).prev = (exec_node *)piVar17;
      peVar23 = this->out_instructions;
      ir_builder::deref::deref((deref *)left_swizzle_name,piVar14);
      oVar15.val._0_4_ =
           (*((oVar15.val)->super_ir_instruction)._vptr_ir_instruction[4])
                     (oVar15.val,this->mem_ctx,0);
      oVar15.val._4_4_ = extraout_var_04;
      oVar15.val = &ir_builder::swizzle(oVar15,0x69a,2)->super_ir_rvalue;
      oVar15.val = &ir_builder::expr(ir_unop_pack_int_2x32,oVar15)->super_ir_rvalue;
      lhs.val._4_4_ = uStack_6c;
      lhs.val._0_1_ = left_swizzle_name[0];
      lhs.val._1_1_ = left_swizzle_name[1];
      lhs.val._2_1_ = left_swizzle_name[2];
      lhs.val._3_1_ = left_swizzle_name[3];
      piVar17 = ir_builder::assign(lhs,oVar15,2);
      if (piVar17 != (ir_assignment *)0x0) {
        piVar17 = (ir_assignment *)&(piVar17->super_ir_instruction).super_exec_node;
      }
      (piVar17->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
      peVar4 = (peVar23->tail_sentinel).prev;
      (piVar17->super_ir_instruction).super_exec_node.next = peVar4;
      peVar4->next = (exec_node *)piVar17;
      (peVar23->tail_sentinel).prev = (exec_node *)piVar17;
      ir_builder::deref::deref((deref *)right_swizzle_name,piVar14);
      goto LAB_001e2c25;
    case 0xc:
      oVar16.val = (ir_rvalue *)exec_node::operator_new(0x58,this->mem_ctx);
      pgVar13 = rvalue->type;
      oVar15.val = &ir_builder::i2u(oVar15)->super_ir_rvalue;
      iVar6 = 0x5e;
      break;
    case 0xd:
      oVar16.val = (ir_rvalue *)exec_node::operator_new(0x58,this->mem_ctx);
      pgVar13 = rvalue->type;
      oVar15.val = &ir_builder::i2u(oVar15)->super_ir_rvalue;
      iVar6 = 0x5f;
    }
    ir_expression::ir_expression
              ((ir_expression *)oVar16.val,iVar6,pgVar13,oVar15.val,(ir_rvalue *)0x0,
               (ir_rvalue *)0x0,(ir_rvalue *)0x0);
LAB_001e2ceb:
    peVar23 = this->out_instructions;
    piVar17 = (ir_assignment *)exec_node::operator_new(0x40,this->mem_ctx);
    goto LAB_001e2d08;
  }
  cVar3 = (oVar15.val)->type->field_0x4;
  pgVar13 = rvalue->type;
  oVar16.val = rvalue;
  if (cVar3 == pgVar13->field_0x4) goto LAB_001e2cb8;
  if (cVar3 != '\x01') {
    __assert_fail("lhs->type->base_type == GLSL_TYPE_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                  ,0x14c,
                  "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                 );
  }
  switch(pgVar13->field_0x4) {
  case 0:
    oVar16.val = (ir_rvalue *)exec_node::operator_new(0x58,this->mem_ctx);
    pgVar13 = (oVar15.val)->type;
    iVar6 = 0x16;
    goto LAB_001e26ae;
  default:
    __assert_fail("!\"Unexpected type conversion while lowering varyings\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                  ,0x18d,
                  "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                 );
  case 2:
    oVar16.val = (ir_rvalue *)exec_node::operator_new(0x58,this->mem_ctx);
    pgVar13 = (oVar15.val)->type;
    iVar6 = 0x23;
LAB_001e26ae:
    ir_expression::ir_expression
              ((ir_expression *)oVar16.val,iVar6,pgVar13,rvalue,(ir_rvalue *)0x0,(ir_rvalue *)0x0,
               (ir_rvalue *)0x0);
    break;
  case 4:
    if (2 < pgVar13->vector_elements) {
      __assert_fail("rhs->type->vector_elements <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x157,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                   );
    }
    if (pgVar13->vector_elements != 2) {
      iVar25 = ir_unop_unpack_double_2x32;
      goto LAB_001e2ca4;
    }
    piVar14 = (ir_variable *)exec_node::operator_new(0x90,this->mem_ctx);
    ir_variable::ir_variable(piVar14,(oVar15.val)->type,"pack",ir_var_temporary);
    if ((oVar15.val)->type->vector_elements != '\x04') {
      __assert_fail("lhs->type->vector_elements == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x15b,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                   );
    }
    peVar23 = this->out_variables;
    peVar20 = &(piVar14->super_ir_instruction).super_exec_node;
    (piVar14->super_ir_instruction).super_exec_node.next = &peVar23->tail_sentinel;
    peVar4 = (peVar23->tail_sentinel).prev;
    (piVar14->super_ir_instruction).super_exec_node.prev = peVar4;
    peVar4->next = peVar20;
    (peVar23->tail_sentinel).prev = peVar20;
    peVar23 = this->out_instructions;
    ir_builder::deref::deref((deref *)right_swizzle_values,piVar14);
    a_00.val._0_4_ =
         (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])(rvalue,this->mem_ctx,0);
    a_00.val._4_4_ = extraout_var_05;
    oVar16.val = &ir_builder::swizzle_x(a_00)->super_ir_rvalue;
    oVar16.val = &ir_builder::expr(ir_unop_unpack_double_2x32,oVar16)->super_ir_rvalue;
    oVar16.val = &ir_builder::u2i(oVar16)->super_ir_rvalue;
    piVar17 = ir_builder::assign((deref)right_swizzle_values._0_8_,oVar16,3);
    if (piVar17 != (ir_assignment *)0x0) {
      piVar17 = (ir_assignment *)&(piVar17->super_ir_instruction).super_exec_node;
    }
    (piVar17->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
    peVar4 = (peVar23->tail_sentinel).prev;
    (piVar17->super_ir_instruction).super_exec_node.next = peVar4;
    peVar4->next = (exec_node *)piVar17;
    (peVar23->tail_sentinel).prev = (exec_node *)piVar17;
    peVar23 = this->out_instructions;
    ir_builder::deref::deref((deref *)left_swizzle_name,piVar14);
    oVar16.val = &ir_builder::swizzle_y(rvalue)->super_ir_rvalue;
    iVar25 = ir_unop_unpack_double_2x32;
LAB_001e2a51:
    oVar16.val = &ir_builder::expr(iVar25,oVar16)->super_ir_rvalue;
    oVar16.val = &ir_builder::u2i(oVar16)->super_ir_rvalue;
LAB_001e2a62:
    lhs_00.val._4_4_ = uStack_6c;
    lhs_00.val._0_1_ = left_swizzle_name[0];
    lhs_00.val._1_1_ = left_swizzle_name[1];
    lhs_00.val._2_1_ = left_swizzle_name[2];
    lhs_00.val._3_1_ = left_swizzle_name[3];
    piVar17 = ir_builder::assign(lhs_00,oVar16,0xc);
    if (piVar17 != (ir_assignment *)0x0) {
      piVar17 = (ir_assignment *)&(piVar17->super_ir_instruction).super_exec_node;
    }
    (piVar17->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
    peVar4 = (peVar23->tail_sentinel).prev;
    (piVar17->super_ir_instruction).super_exec_node.next = peVar4;
    peVar4->next = (exec_node *)piVar17;
    (peVar23->tail_sentinel).prev = (exec_node *)piVar17;
    ir_builder::deref::deref((deref *)right_swizzle_name,piVar14);
    oVar16.val = (ir_rvalue *)CONCAT44(uStack_74,right_swizzle_name);
    break;
  case 9:
    if (2 < pgVar13->vector_elements) {
      __assert_fail("rhs->type->vector_elements <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x177,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                   );
    }
    if (pgVar13->vector_elements == 2) {
      piVar14 = (ir_variable *)exec_node::operator_new(0x90,this->mem_ctx);
      ir_variable::ir_variable(piVar14,(oVar15.val)->type,"pack",ir_var_temporary);
      if ((oVar15.val)->type->vector_elements != '\x04') {
        __assert_fail("lhs->type->vector_elements == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x17b,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      peVar23 = this->out_variables;
      peVar20 = &(piVar14->super_ir_instruction).super_exec_node;
      (piVar14->super_ir_instruction).super_exec_node.next = &peVar23->tail_sentinel;
      peVar4 = (peVar23->tail_sentinel).prev;
      (piVar14->super_ir_instruction).super_exec_node.prev = peVar4;
      peVar4->next = peVar20;
      (peVar23->tail_sentinel).prev = peVar20;
      peVar23 = this->out_instructions;
      ir_builder::deref::deref((deref *)right_swizzle_values,piVar14);
      a_03.val._0_4_ =
           (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])(rvalue,this->mem_ctx,0);
      a_03.val._4_4_ = extraout_var_08;
      oVar16.val = &ir_builder::swizzle_x(a_03)->super_ir_rvalue;
      oVar16.val = &ir_builder::expr(ir_last_unop,oVar16)->super_ir_rvalue;
      oVar16.val = &ir_builder::u2i(oVar16)->super_ir_rvalue;
      piVar17 = ir_builder::assign((deref)right_swizzle_values._0_8_,oVar16,3);
      if (piVar17 != (ir_assignment *)0x0) {
        piVar17 = (ir_assignment *)&(piVar17->super_ir_instruction).super_exec_node;
      }
      (piVar17->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
      peVar4 = (peVar23->tail_sentinel).prev;
      (piVar17->super_ir_instruction).super_exec_node.next = peVar4;
      peVar4->next = (exec_node *)piVar17;
      (peVar23->tail_sentinel).prev = (exec_node *)piVar17;
      peVar23 = this->out_instructions;
      ir_builder::deref::deref((deref *)left_swizzle_name,piVar14);
      oVar16.val = &ir_builder::swizzle_y(rvalue)->super_ir_rvalue;
      iVar25 = ir_last_unop;
      goto LAB_001e2a51;
    }
    iVar25 = ir_last_unop;
    goto LAB_001e2ca4;
  case 10:
    if (2 < pgVar13->vector_elements) {
      __assert_fail("rhs->type->vector_elements <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                    ,0x167,
                    "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                   );
    }
    if (pgVar13->vector_elements == 2) {
      piVar14 = (ir_variable *)exec_node::operator_new(0x90,this->mem_ctx);
      ir_variable::ir_variable(piVar14,(oVar15.val)->type,"pack",ir_var_temporary);
      if ((oVar15.val)->type->vector_elements != '\x04') {
        __assert_fail("lhs->type->vector_elements == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                      ,0x16b,
                      "void (anonymous namespace)::lower_packed_varyings_visitor::bitwise_assign_pack(ir_rvalue *, ir_rvalue *)"
                     );
      }
      peVar23 = this->out_variables;
      peVar20 = &(piVar14->super_ir_instruction).super_exec_node;
      (piVar14->super_ir_instruction).super_exec_node.next = &peVar23->tail_sentinel;
      peVar4 = (peVar23->tail_sentinel).prev;
      (piVar14->super_ir_instruction).super_exec_node.prev = peVar4;
      peVar4->next = peVar20;
      (peVar23->tail_sentinel).prev = peVar20;
      peVar23 = this->out_instructions;
      ir_builder::deref::deref((deref *)right_swizzle_values,piVar14);
      a.val._0_4_ = (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])
                              (rvalue,this->mem_ctx,0);
      a.val._4_4_ = extraout_var_02;
      oVar16.val = &ir_builder::swizzle_x(a)->super_ir_rvalue;
      oVar16.val = &ir_builder::expr(ir_unop_unpack_int_2x32,oVar16)->super_ir_rvalue;
      piVar17 = ir_builder::assign((deref)right_swizzle_values._0_8_,oVar16,3);
      if (piVar17 != (ir_assignment *)0x0) {
        piVar17 = (ir_assignment *)&(piVar17->super_ir_instruction).super_exec_node;
      }
      (piVar17->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&peVar23->tail_sentinel;
      peVar4 = (peVar23->tail_sentinel).prev;
      (piVar17->super_ir_instruction).super_exec_node.next = peVar4;
      peVar4->next = (exec_node *)piVar17;
      (peVar23->tail_sentinel).prev = (exec_node *)piVar17;
      peVar23 = this->out_instructions;
      ir_builder::deref::deref((deref *)left_swizzle_name,piVar14);
      oVar16.val = &ir_builder::swizzle_y(rvalue)->super_ir_rvalue;
      oVar16.val = &ir_builder::expr(ir_unop_unpack_int_2x32,oVar16)->super_ir_rvalue;
      goto LAB_001e2a62;
    }
    oVar16.val = &ir_builder::expr(ir_unop_unpack_int_2x32,rvalue)->super_ir_rvalue;
    break;
  case 0xc:
    iVar25 = ir_unop_unpack_sampler_2x32;
    goto LAB_001e2ca4;
  case 0xd:
    iVar25 = ir_unop_unpack_image_2x32;
LAB_001e2ca4:
    oVar16.val = &ir_builder::expr(iVar25,rvalue)->super_ir_rvalue;
    oVar16.val = &ir_builder::u2i(oVar16)->super_ir_rvalue;
  }
LAB_001e2cb8:
  peVar23 = this->out_instructions;
  piVar17 = (ir_assignment *)exec_node::operator_new(0x40,this->mem_ctx);
  rvalue = oVar15.val;
LAB_001e2d08:
  ir_assignment::ir_assignment(piVar17,rvalue,oVar16.val,(ir_rvalue *)0x0);
  peVar4 = &(piVar17->super_ir_instruction).super_exec_node;
  (piVar17->super_ir_instruction).super_exec_node.next = &peVar23->tail_sentinel;
  peVar20 = (peVar23->tail_sentinel).prev;
  (piVar17->super_ir_instruction).super_exec_node.prev = peVar20;
  peVar20->next = peVar4;
  (peVar23->tail_sentinel).prev = peVar4;
  return uVar21 + fine_location;
}

Assistant:

unsigned
lower_packed_varyings_visitor::lower_rvalue(ir_rvalue *rvalue,
                                            unsigned fine_location,
                                            ir_variable *unpacked_var,
                                            const char *name,
                                            bool gs_input_toplevel,
                                            unsigned vertex_index)
{
   unsigned dmul = rvalue->type->is_64bit() ? 2 : 1;
   /* When gs_input_toplevel is set, we should be looking at a geometry shader
    * input array.
    */
   assert(!gs_input_toplevel || rvalue->type->is_array());

   if (rvalue->type->is_struct()) {
      for (unsigned i = 0; i < rvalue->type->length; i++) {
         if (i != 0)
            rvalue = rvalue->clone(this->mem_ctx, NULL);
         const char *field_name = rvalue->type->fields.structure[i].name;
         ir_dereference_record *dereference_record = new(this->mem_ctx)
            ir_dereference_record(rvalue, field_name);
         char *deref_name
            = ralloc_asprintf(this->mem_ctx, "%s.%s", name, field_name);
         fine_location = this->lower_rvalue(dereference_record, fine_location,
                                            unpacked_var, deref_name, false,
                                            vertex_index);
      }
      return fine_location;
   } else if (rvalue->type->is_array()) {
      /* Arrays are packed/unpacked by considering each array element in
       * sequence.
       */
      return this->lower_arraylike(rvalue, rvalue->type->array_size(),
                                   fine_location, unpacked_var, name,
                                   gs_input_toplevel, vertex_index);
   } else if (rvalue->type->is_matrix()) {
      /* Matrices are packed/unpacked by considering each column vector in
       * sequence.
       */
      return this->lower_arraylike(rvalue, rvalue->type->matrix_columns,
                                   fine_location, unpacked_var, name,
                                   false, vertex_index);
   } else if (rvalue->type->vector_elements * dmul +
              fine_location % 4 > 4) {
      /* This vector is going to be "double parked" across two varying slots,
       * so handle it as two separate assignments. For doubles, a dvec3/dvec4
       * can end up being spread over 3 slots. However the second splitting
       * will happen later, here we just always want to split into 2.
       */
      unsigned left_components, right_components;
      unsigned left_swizzle_values[4] = { 0, 0, 0, 0 };
      unsigned right_swizzle_values[4] = { 0, 0, 0, 0 };
      char left_swizzle_name[4] = { 0, 0, 0, 0 };
      char right_swizzle_name[4] = { 0, 0, 0, 0 };

      left_components = 4 - fine_location % 4;
      if (rvalue->type->is_64bit()) {
         /* We might actually end up with 0 left components! */
         left_components /= 2;
      }
      right_components = rvalue->type->vector_elements - left_components;

      for (unsigned i = 0; i < left_components; i++) {
         left_swizzle_values[i] = i;
         left_swizzle_name[i] = "xyzw"[i];
      }
      for (unsigned i = 0; i < right_components; i++) {
         right_swizzle_values[i] = i + left_components;
         right_swizzle_name[i] = "xyzw"[i + left_components];
      }
      ir_swizzle *left_swizzle = new(this->mem_ctx)
         ir_swizzle(rvalue, left_swizzle_values, left_components);
      ir_swizzle *right_swizzle = new(this->mem_ctx)
         ir_swizzle(rvalue->clone(this->mem_ctx, NULL), right_swizzle_values,
                    right_components);
      char *left_name
         = ralloc_asprintf(this->mem_ctx, "%s.%s", name, left_swizzle_name);
      char *right_name
         = ralloc_asprintf(this->mem_ctx, "%s.%s", name, right_swizzle_name);
      if (left_components)
         fine_location = this->lower_rvalue(left_swizzle, fine_location,
                                            unpacked_var, left_name, false,
                                            vertex_index);
      else
         /* Top up the fine location to the next slot */
         fine_location++;
      return this->lower_rvalue(right_swizzle, fine_location, unpacked_var,
                                right_name, false, vertex_index);
   } else {
      /* No special handling is necessary; pack the rvalue into the
       * varying.
       */
      unsigned swizzle_values[4] = { 0, 0, 0, 0 };
      unsigned components = rvalue->type->vector_elements * dmul;
      unsigned location = fine_location / 4;
      unsigned location_frac = fine_location % 4;
      for (unsigned i = 0; i < components; ++i)
         swizzle_values[i] = i + location_frac;
      ir_dereference *packed_deref =
         this->get_packed_varying_deref(location, unpacked_var, name,
                                        vertex_index);
      if (unpacked_var->data.stream != 0) {
         assert(unpacked_var->data.stream < 4);
         ir_variable *packed_var = packed_deref->variable_referenced();
         for (unsigned i = 0; i < components; ++i) {
            packed_var->data.stream |=
               unpacked_var->data.stream << (2 * (location_frac + i));
         }
      }
      ir_swizzle *swizzle = new(this->mem_ctx)
         ir_swizzle(packed_deref, swizzle_values, components);
      if (this->mode == ir_var_shader_out) {
         this->bitwise_assign_pack(swizzle, rvalue);
      } else {
         this->bitwise_assign_unpack(rvalue, swizzle);
      }
      return fine_location + components;
   }
}